

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.cxx
# Opt level: O3

void cmVariableWatchCommandVariableAccessed
               (string *variable,int access_type,void *client_data,char *newValue,cmMakefile *mf)

{
  pointer pcVar1;
  long *plVar2;
  pointer pcVar3;
  pointer pcVar4;
  bool bVar5;
  char *pcVar6;
  ostream *poVar7;
  size_t sVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  pointer pcVar10;
  cmExecutionStatus status;
  char *accessString;
  char *currentListFile;
  string stack;
  cmListFileFunction newLFF;
  ostringstream error;
  cmListFileArgument arg;
  string local_2d0;
  cmMakefile *local_2b0;
  cmExecutionStatus local_2a4;
  char *local_2a0;
  char *local_298;
  char *local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  undefined1 local_268 [80];
  undefined1 local_218 [16];
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_208;
  undefined1 local_1f0 [112];
  ios_base local_180 [264];
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  undefined4 local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  
  if (*client_data != '\0') {
    return;
  }
  *(undefined1 *)client_data = 1;
  local_268._0_8_ = local_268 + 0x10;
  local_268._8_8_ = 0;
  local_268[0x10] = '\0';
  local_268._32_8_ = local_268 + 0x30;
  local_268._40_8_ = 0;
  local_268[0x30] = '\0';
  local_268._64_16_ = (undefined1  [16])0x0;
  local_218 = (undefined1  [16])0x0;
  local_208.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78 = &local_68;
  local_70 = 0;
  local_68 = 0;
  local_58 = 0;
  local_50 = 0;
  local_48 = 0xffffffff;
  uStack_44 = 0xffffffff;
  uStack_40 = 0xffffffff;
  uStack_3c = 0xffffffff;
  local_38 = 0xffffffffffffffff;
  local_2a0 = newValue;
  local_298 = cmVariableWatch::GetAccessAsString(access_type);
  pcVar1 = local_1f0 + 0x10;
  local_1f0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"CMAKE_CURRENT_LIST_FILE","");
  local_2b0 = mf;
  local_290 = cmMakefile::GetDefinition(mf,(string *)local_1f0);
  if ((pointer)local_1f0._0_8_ != pcVar1) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  local_1f0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"LISTFILE_STACK","");
  pcVar6 = cmMakefile::GetProperty(local_2b0,(string *)local_1f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,pcVar6,(allocator<char> *)&local_2d0);
  if ((pointer)local_1f0._0_8_ != pcVar1) {
    operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
  }
  if (*(long *)((long)client_data + 0x10) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,"Variable \"",10);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1f0,(variable->_M_dataplus)._M_p,variable->_M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" was accessed using ",0x15);
    pcVar6 = local_298;
    if (local_298 == (char *)0x0) {
      std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
    }
    else {
      sVar8 = strlen(local_298);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," with value \"",0xd);
    pcVar6 = "";
    if (local_2a0 != (char *)0x0) {
      pcVar6 = local_2a0;
    }
    sVar8 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".",2);
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(local_2b0,LOG,&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_2d0._M_dataplus._M_p._4_4_,local_2d0._M_dataplus._M_p._0_4_) !=
        &local_2d0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_2d0._M_dataplus._M_p._4_4_,local_2d0._M_dataplus._M_p._0_4_),
                      local_2d0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
    std::ios_base::~ios_base(local_180);
  }
  else {
    pcVar3 = local_208.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pcVar4 = local_208.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (local_208.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_208.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      paVar9 = &((local_208.
                  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                  _M_impl.super__Vector_impl_data._M_start)->Value).field_2;
      do {
        plVar2 = (long *)(((string *)(paVar9 + -1))->_M_dataplus)._M_p;
        if (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)plVar2) {
          operator_delete(plVar2,paVar9->_M_allocated_capacity + 1);
        }
        pcVar10 = (pointer)((long)paVar9 + 0x38);
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((long)paVar9 + 0x48);
      } while (pcVar10 != pcVar4);
      local_208.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar3;
    }
    local_1f0._0_4_ = Quoted;
    local_2d0._M_dataplus._M_p._0_4_ = 9999;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<std::__cxx11::string_const&,cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)&local_208,variable,
               (Delimiter *)local_1f0,(int *)&local_2d0);
    local_1f0._0_4_ = 1;
    local_2d0._M_dataplus._M_p._0_4_ = 9999;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<char_const*&,cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)&local_208,
               &local_298,(Delimiter *)local_1f0,(int *)&local_2d0);
    local_1f0._0_8_ = "";
    if (local_2a0 != (char *)0x0) {
      local_1f0._0_8_ = local_2a0;
    }
    local_2d0._M_dataplus._M_p._0_4_ = 1;
    local_2a4.ReturnInvoked = true;
    local_2a4.BreakInvoked = true;
    local_2a4.ContinueInvoked = false;
    local_2a4.NestedError = false;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<char_const*,cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)&local_208,
               (char **)local_1f0,(Delimiter *)&local_2d0,(int *)&local_2a4);
    local_1f0._0_4_ = Quoted;
    local_2d0._M_dataplus._M_p._0_4_ = 9999;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<char_const*&,cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)&local_208,
               &local_290,(Delimiter *)local_1f0,(int *)&local_2d0);
    local_1f0._0_4_ = 1;
    local_2d0._M_dataplus._M_p._0_4_ = 9999;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<std::__cxx11::string&,cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)&local_208,
               &local_288,(Delimiter *)local_1f0,(int *)&local_2d0);
    cmCommandContext::cmCommandName::operator=
              ((cmCommandName *)local_268,(string *)((long)client_data + 8));
    local_268._64_8_ = 9999;
    local_2a4.ReturnInvoked = false;
    local_2a4.BreakInvoked = false;
    local_2a4.ContinueInvoked = false;
    local_2a4.NestedError = false;
    bVar5 = cmMakefile::ExecuteCommand(local_2b0,(cmListFileFunction *)local_268,&local_2a4);
    if (!bVar5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,"Error in cmake code at\nUnknown:0:\n",0x22);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,"A command failed during the invocation of callback \"",0x34);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1f0,*(char **)((long)client_data + 8),
                          *(long *)((long)client_data + 0x10));
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".",2);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(&local_2d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_2d0._M_dataplus._M_p._4_4_,local_2d0._M_dataplus._M_p._0_4_) !=
          &local_2d0.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_2d0._M_dataplus._M_p._4_4_,local_2d0._M_dataplus._M_p._0_4_),
                        local_2d0.field_2._M_allocated_capacity + 1);
      }
      *(undefined1 *)client_data = 0;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
      std::ios_base::~ios_base(local_180);
      goto LAB_001f652f;
    }
  }
  *(undefined1 *)client_data = 0;
LAB_001f652f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_208);
  if ((undefined1 *)local_268._32_8_ != local_268 + 0x30) {
    operator_delete((void *)local_268._32_8_,CONCAT71(local_268._49_7_,local_268[0x30]) + 1);
  }
  if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
    operator_delete((void *)local_268._0_8_,CONCAT71(local_268._17_7_,local_268[0x10]) + 1);
  }
  return;
}

Assistant:

static void cmVariableWatchCommandVariableAccessed(const std::string& variable,
                                                   int access_type,
                                                   void* client_data,
                                                   const char* newValue,
                                                   const cmMakefile* mf)
{
  cmVariableWatchCallbackData* data =
    static_cast<cmVariableWatchCallbackData*>(client_data);

  if (data->InCallback) {
    return;
  }
  data->InCallback = true;

  cmListFileFunction newLFF;
  cmListFileArgument arg;
  bool processed = false;
  const char* accessString = cmVariableWatch::GetAccessAsString(access_type);
  const char* currentListFile = mf->GetDefinition("CMAKE_CURRENT_LIST_FILE");

  /// Ultra bad!!
  cmMakefile* makefile = const_cast<cmMakefile*>(mf);

  std::string stack = makefile->GetProperty("LISTFILE_STACK");
  if (!data->Command.empty()) {
    newLFF.Arguments.clear();
    newLFF.Arguments.emplace_back(variable, cmListFileArgument::Quoted, 9999);
    newLFF.Arguments.emplace_back(accessString, cmListFileArgument::Quoted,
                                  9999);
    newLFF.Arguments.emplace_back(newValue ? newValue : "",
                                  cmListFileArgument::Quoted, 9999);
    newLFF.Arguments.emplace_back(currentListFile, cmListFileArgument::Quoted,
                                  9999);
    newLFF.Arguments.emplace_back(stack, cmListFileArgument::Quoted, 9999);
    newLFF.Name = data->Command;
    newLFF.Line = 9999;
    cmExecutionStatus status;
    if (!makefile->ExecuteCommand(newLFF, status)) {
      std::ostringstream error;
      error << "Error in cmake code at\nUnknown:0:\n"
            << "A command failed during the invocation of callback \""
            << data->Command << "\".";
      cmSystemTools::Error(error.str());
      data->InCallback = false;
      return;
    }
    processed = true;
  }
  if (!processed) {
    std::ostringstream msg;
    msg << "Variable \"" << variable << "\" was accessed using "
        << accessString << " with value \"" << (newValue ? newValue : "")
        << "\".";
    makefile->IssueMessage(MessageType::LOG, msg.str());
  }

  data->InCallback = false;
}